

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<std::array<tinyusdz::value::half,2ul>>
          (Attribute *this,double t,array<tinyusdz::value::half,_2UL> *dst,
          TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *pvVar2;
  optional<std::array<tinyusdz::value::half,_2UL>_> local_44;
  optional<std::array<tinyusdz::value::half,_2UL>_> local_3e;
  optional<std::array<tinyusdz::value::half,_2UL>_> v;
  TimeSampleInterpolationType tinterp_local;
  array<tinyusdz::value::half,_2UL> *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (array<tinyusdz::value::half,_2UL> *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)&stack0xffffffffffffffc8,t);
    bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&stack0xffffffffffffffc8);
    if ((bVar1) && (bVar1 = has_value(this), bVar1)) {
      primvar::PrimVar::get_value<std::array<tinyusdz::value::half,2ul>>(&local_44,&this->_var);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::
      optional<std::array<tinyusdz::value::half,_2UL>,_0>(&local_3e,&local_44);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::~optional(&local_44)
      ;
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_3e);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::value
                           (&local_3e);
        *(undefined4 *)dst->_M_elems = *(undefined4 *)pvVar2->_M_elems;
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::~optional(&local_3e)
      ;
      if (bVar1) goto LAB_002ce8d6;
    }
    bVar1 = has_timesamples(this);
    if (bVar1) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<std::array<tinyusdz::value::half,2ul>>
                     (&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<std::array<tinyusdz::value::half,2ul>>(this,dst);
    }
  }
LAB_002ce8d6:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }